

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemorySSA.cpp
# Opt level: O0

void __thiscall
dg::dda::MemorySSATransformation::fillDefinitionsFromCall
          (MemorySSATransformation *this,Definitions *D,RWNodeCall *C,DefSite *ds)

{
  bool bVar1;
  iterator D_00;
  iterator ds_00;
  reference o;
  RWNodeCall *pRVar2;
  reference this_00;
  RWSubgraph *pRVar3;
  undefined8 *in_RCX;
  RWNodeCall *in_RDX;
  RWSubgraph *subg;
  RWCalledValue *callee;
  iterator __end3;
  iterator __begin3;
  CalleesT *__range3;
  RWNode *phi;
  DefSite uncoveredds;
  DiscreteInterval<dg::Offset> *interval;
  iterator __end2;
  iterator __begin2;
  vector<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
  *__range2;
  vector<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
  uncovered;
  RWNode *in_stack_ffffffffffffff28;
  RWNodeCall *in_stack_ffffffffffffff30;
  RWNodeCall *in_stack_ffffffffffffff38;
  RWNode *in_stack_ffffffffffffff40;
  __normal_iterator<dg::dda::RWCalledValue_*,_std::vector<dg::dda::RWCalledValue,_std::allocator<dg::dda::RWCalledValue>_>_>
  local_90;
  RWNode *in_stack_ffffffffffffff78;
  RWNodeCall *in_stack_ffffffffffffff80;
  RWNodeCall *pRVar4;
  Offset in_stack_ffffffffffffff88;
  GenericDefSite<dg::dda::RWNode> local_70;
  reference pDVar5;
  MemorySSATransformation *this_01;
  undefined1 local_38 [32];
  RWNodeCall *local_18;
  RWNodeType type;
  
  local_38._24_8_ = in_RCX;
  local_18 = in_RDX;
  bVar1 = callMayDefineTarget((MemorySSATransformation *)in_stack_ffffffffffffff88.offset,
                              in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  if (bVar1) {
    Definitions::uncovered
              ((Definitions *)in_stack_ffffffffffffff38,(DefSite *)in_stack_ffffffffffffff30);
    this_01 = (MemorySSATransformation *)local_38;
    D_00 = std::
           vector<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
           ::begin((vector<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
                    *)in_stack_ffffffffffffff28);
    ds_00 = std::
            vector<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
            ::end((vector<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
                   *)in_stack_ffffffffffffff28);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<dg::ADT::DiscreteInterval<dg::Offset>_*,_std::vector<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>_>
                               *)in_stack_ffffffffffffff30,
                              (__normal_iterator<dg::ADT::DiscreteInterval<dg::Offset>_*,_std::vector<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>_>
                               *)in_stack_ffffffffffffff28), bVar1) {
      o = __gnu_cxx::
          __normal_iterator<dg::ADT::DiscreteInterval<dg::Offset>_*,_std::vector<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>_>
          ::operator*((__normal_iterator<dg::ADT::DiscreteInterval<dg::Offset>_*,_std::vector<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>_>
                       *)&stack0xffffffffffffffb8);
      in_stack_ffffffffffffff40 = *(RWNode **)local_38._24_8_;
      pDVar5 = o;
      ADT::DiscreteInterval<dg::Offset>::length
                ((DiscreteInterval<dg::Offset> *)in_stack_ffffffffffffff38);
      type = (RWNodeType)((ulong)pDVar5 >> 0x20);
      GenericDefSite<dg::dda::RWNode>::GenericDefSite
                (&local_70,in_stack_ffffffffffffff40,&o->start,(Offset *)&stack0xffffffffffffff88);
      pRVar2 = (RWNodeCall *)
               createPhi(this_01,(Definitions *)D_00._M_current,(DefSite *)ds_00._M_current,type);
      RWNode::getBBlock(&local_18->super_RWNode);
      BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>::append
                ((BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode> *)in_stack_ffffffffffffff30,
                 in_stack_ffffffffffffff28);
      RWNodeCall::addOutput(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      RWNodeCall::getCallees(local_18);
      local_90._M_current =
           (RWCalledValue *)
           std::vector<dg::dda::RWCalledValue,_std::allocator<dg::dda::RWCalledValue>_>::begin
                     ((vector<dg::dda::RWCalledValue,_std::allocator<dg::dda::RWCalledValue>_> *)
                      in_stack_ffffffffffffff28);
      std::vector<dg::dda::RWCalledValue,_std::allocator<dg::dda::RWCalledValue>_>::end
                ((vector<dg::dda::RWCalledValue,_std::allocator<dg::dda::RWCalledValue>_> *)
                 in_stack_ffffffffffffff28);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<dg::dda::RWCalledValue_*,_std::vector<dg::dda::RWCalledValue,_std::allocator<dg::dda::RWCalledValue>_>_>
                                 *)in_stack_ffffffffffffff30,
                                (__normal_iterator<dg::dda::RWCalledValue_*,_std::vector<dg::dda::RWCalledValue,_std::allocator<dg::dda::RWCalledValue>_>_>
                                 *)in_stack_ffffffffffffff28), bVar1) {
        this_00 = __gnu_cxx::
                  __normal_iterator<dg::dda::RWCalledValue_*,_std::vector<dg::dda::RWCalledValue,_std::allocator<dg::dda::RWCalledValue>_>_>
                  ::operator*(&local_90);
        pRVar3 = RWCalledValue::getSubgraph(this_00);
        if (pRVar3 == (RWSubgraph *)0x0) {
          in_stack_ffffffffffffff38 = local_18;
          pRVar4 = pRVar2;
          RWCalledValue::getCalledValue(this_00);
          addDefinitionsFromCalledValue
                    ((MemorySSATransformation *)__range3,(RWNode *)__begin3._M_current,
                     (RWNodeCall *)__end3._M_current,(DefSite *)callee,(RWNode *)subg);
          in_stack_ffffffffffffff30 = pRVar2;
          pRVar2 = pRVar4;
        }
        else {
          findDefinitionsInSubgraph
                    (this,(RWNode *)D,C,ds,
                     (RWSubgraph *)
                     uncovered.
                     super__Vector_base<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        __gnu_cxx::
        __normal_iterator<dg::dda::RWCalledValue_*,_std::vector<dg::dda::RWCalledValue,_std::allocator<dg::dda::RWCalledValue>_>_>
        ::operator++(&local_90);
      }
      __gnu_cxx::
      __normal_iterator<dg::ADT::DiscreteInterval<dg::Offset>_*,_std::vector<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>_>
      ::operator++((__normal_iterator<dg::ADT::DiscreteInterval<dg::Offset>_*,_std::vector<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>_>
                    *)&stack0xffffffffffffffb8);
    }
    std::
    vector<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
    ::~vector((vector<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
               *)in_stack_ffffffffffffff40);
  }
  return;
}

Assistant:

void MemorySSATransformation::fillDefinitionsFromCall(Definitions &D,
                                                      RWNodeCall *C,
                                                      const DefSite &ds) {
    if (!callMayDefineTarget(C, ds.target))
        return;

    // find the uncovered parts of the sought definition
    auto uncovered = D.uncovered(ds);
    for (auto &interval : uncovered) {
        auto uncoveredds =
                DefSite{ds.target, interval.start, interval.length()};
        // this phi will merge the definitions from all the
        // possibly called subgraphs
        auto *phi = createPhi(D, uncoveredds, RWNodeType::CALLOUT);
        C->getBBlock()->append(phi);
        C->addOutput(phi);

        // recursively find definitions for this phi node
        for (auto &callee : C->getCallees()) {
            if (auto *subg = callee.getSubgraph()) {
                findDefinitionsInSubgraph(phi, C, uncoveredds, subg);
            } else {
                addDefinitionsFromCalledValue(phi, C, uncoveredds,
                                              callee.getCalledValue());
            }
        }
    }
}